

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O1

ostream * operator<<(ostream *os,Graph<Node> *g)

{
  undefined8 in_RAX;
  ostream *poVar1;
  long lVar2;
  long lVar3;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(os,"Graph:\n\n",8);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)os,g->_nodeCnt);
  uStack_38._0_7_ = CONCAT16(0x20,(undefined6)uStack_38);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar1,(char *)((long)&uStack_38 + 6),1);
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,g->_edgeCnt);
  uStack_38 = CONCAT17(10,(undefined7)uStack_38);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_38 + 7),1);
  if (0 < g->_edgeCnt) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)os,*(int *)((long)&((g->edges).vect)->_nodeS + lVar2));
      uStack_38._0_4_ = CONCAT13(0x20,(undefined3)uStack_38);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(char *)((long)&uStack_38 + 3),1);
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar1,*(int *)((long)&((g->edges).vect)->_nodeD + lVar2));
      uStack_38._0_5_ = CONCAT14(0x20,(undefined4)uStack_38);
      poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar1,(char *)((long)&uStack_38 + 4),1);
      poVar1 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)poVar1,*(int *)((long)&((g->edges).vect)->_cost + lVar2));
      uStack_38._0_6_ = CONCAT15(10,(undefined5)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar1,(char *)((long)&uStack_38 + 5),1);
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0xc;
    } while (lVar3 < g->_edgeCnt);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,"------------------------\n\n",0x1a);
  return os;
}

Assistant:

std::ostream &operator << (std::ostream &os, const Graph <NodeT> &g) {
        os << "Graph:\n\n";
        os << g._nodeCnt << ' ' << g._edgeCnt << '\n';
        for (int i = 0; i < g._edgeCnt; ++i) {
            os << g.getEdge(i).getSource() << ' ' << g.getEdge(i).getDest() << ' ' << g.getEdge(i).getCost() << '\n';
        }

        os << "------------------------\n\n";
        return os;
    }